

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::Cord::RemoveSuffix(Cord *this,size_t n)

{
  size_t sVar1;
  Nullable<absl::cord_internal::CordRep_*> rep;
  CordzInfo *info;
  CordRep *rep_00;
  CordRepBtree *tree;
  CordRep *rep_01;
  ulong uVar2;
  AlphaNum *in_R9;
  CordzUpdateScope scope;
  string local_f8;
  string death_message;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  sVar1 = InlineRep::size(&this->contents_);
  if (sVar1 < n) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&death_message,"Check n <= size() failed: ",(allocator<char> *)&scope);
    _scope = NullSafeStringView("Requested suffix size ");
    AlphaNum::AlphaNum(&local_58,n);
    local_88.piece_ = NullSafeStringView(" exceeds Cord\'s size ");
    sVar1 = size(this);
    AlphaNum::AlphaNum(&local_b8,sVar1);
    StrCat_abi_cxx11_(&local_f8,(absl *)&scope,&local_58,&local_88,&local_b8,in_R9);
    std::__cxx11::string::operator+=((string *)&death_message,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/cord.cc"
               ,0x2c5,&death_message);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  rep = InlineRep::tree(&this->contents_);
  if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    InlineRep::reduce_size(&this->contents_,n);
    return;
  }
  info = cord_internal::InlineData::cordz_info((InlineData *)this);
  cord_internal::CordzUpdateScope::CordzUpdateScope(&scope,info,kRemoveSuffix);
  rep_00 = cord_internal::RemoveCrcNode(rep);
  uVar2 = rep_00->length;
  if (uVar2 <= n) {
    cord_internal::CordRep::Unref(rep_00);
    rep_01 = (Nullable<CordRep_*>)0x0;
    goto LAB_00129400;
  }
  if (rep_00->tag != '\x05') {
    if (rep_00->tag == '\x03') {
      tree = cord_internal::CordRep::btree(rep_00);
      rep_01 = cord_internal::CordRepBtree::RemoveSuffix(tree,n);
      goto LAB_00129400;
    }
    if ((rep_00->refcount).count_.super___atomic_base<int>._M_i == 2) {
      if (rep_00->tag != 1 && rep_00->tag < 6) {
        __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/cord.cc"
                      ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
      }
      rep_00->length = rep_00->length - n;
      rep_01 = rep_00;
      goto LAB_00129400;
    }
    uVar2 = rep_00->length;
  }
  rep_01 = cord_internal::CordRepSubstring::Substring(rep_00,0,uVar2 - n);
  cord_internal::CordRep::Unref(rep_00);
LAB_00129400:
  InlineRep::SetTreeOrEmpty(&this->contents_,rep_01,&scope);
  cord_internal::CordzUpdateScope::~CordzUpdateScope(&scope);
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}